

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O3

void __thiscall SpriteBase::make_alpha_mask(SpriteBase *this)

{
  uint8_t *puVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  
  uVar3 = this->height * this->width;
  if (uVar3 != 0) {
    puVar1 = this->data;
    bVar4 = 0xff;
    bVar6 = 0xff;
    uVar5 = 0;
    do {
      bVar2 = bVar4;
      if (puVar1[uVar5 * 4 + 3] != '\0') {
        bVar6 = ~(byte)(int)((double)puVar1[uVar5 * 4] * 0.07 +
                            (double)puVar1[uVar5 * 4 + 2] * 0.21 +
                            (double)puVar1[uVar5 * 4 + 1] * 0.72);
        puVar1[uVar5 * 4 + 3] = bVar6;
        puVar1[uVar5 * 4 + 2] = '\0';
        (puVar1 + uVar5 * 4)[0] = '\0';
        (puVar1 + uVar5 * 4)[1] = '\0';
        bVar2 = bVar6;
        if (bVar4 < bVar6) {
          bVar6 = bVar4;
          bVar2 = bVar4;
        }
      }
      bVar4 = bVar2;
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) <= uVar3 && uVar3 - (uVar5 & 0xffffffff) != 0);
    uVar5 = 0;
    do {
      if (puVar1[uVar5 * 4 + 3] != '\0') {
        puVar1[uVar5 * 4 + 3] = puVar1[uVar5 * 4 + 3] - bVar6;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) <= uVar3 && uVar3 - (uVar5 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void
SpriteBase::make_alpha_mask() {
  Color *c = reinterpret_cast<Color*>(data);
  uint8_t min = 0xFF;
  for (unsigned int i = 0; i < width * height; i++) {
    if (c->alpha != 0x00) {
      c->alpha = 0xff - static_cast<uint8_t>((0.21 * c->red) +
                                             (0.72 * c->green) +
                                             (0.07 * c->blue));
      c->red = 0;
      c->green = 0;
      c->blue = 0;
      min = std::min(min, c->alpha);
    }
    c++;
  }

  c = reinterpret_cast<Color*>(data);
  for (unsigned int i = 0; i < width * height; i++) {
    if (c->alpha != 0x00) {
      c->alpha = c->alpha - min;
    }
    c++;
  }
}